

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void dequantize_row_iq4_xs(block_iq4_xs *x,float *y,int64_t k)

{
  block_iq4_xs *pbVar1;
  float fVar2;
  byte bVar3;
  ushort uVar4;
  long lVar5;
  int j;
  long lVar6;
  long lVar7;
  uint8_t *puVar8;
  int ib;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  
  lVar5 = k + 0xff;
  if (-1 < k) {
    lVar5 = k;
  }
  if (0xff < k) {
    lVar7 = 0;
    do {
      pbVar1 = x + lVar7;
      puVar8 = pbVar1->qs;
      fVar2 = ggml_table_f32_f16[pbVar1->d];
      uVar4 = pbVar1->scales_h;
      uVar10 = 0;
      do {
        fVar11 = (float)(int)((uVar4 >> ((char)uVar10 * '\x02' & 0x1fU) & 3) * 0x10 +
                              (x[lVar7].scales_l[uVar10 >> 1] >> ((char)uVar10 * '\x04' & 4U) & 0xf)
                             + -0x20) * fVar2;
        lVar6 = 0;
        do {
          bVar3 = puVar8[lVar6];
          y[lVar6] = (float)(int)kvalues_iq4nl[bVar3 & 0xf] * fVar11;
          y[lVar6 + 0x10] = (float)(int)kvalues_iq4nl[bVar3 >> 4] * fVar11;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x10);
        y = y + 0x20;
        puVar8 = puVar8 + 0x10;
        uVar9 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar9;
      } while (uVar9 != 8);
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar5 >> 8);
  }
  return;
}

Assistant:

void dequantize_row_iq4_xs(const block_iq4_xs * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {

        const uint8_t * qs = x[i].qs;

        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (int ib = 0; ib < QK_K/32; ++ib) {
            const int ls = ((x[i].scales_l[ib/2] >> 4*(ib%2)) & 0xf) | (((x[i].scales_h >> 2*ib) & 3) << 4);
            const float dl = d * (ls - 32);
            for (int j = 0; j < 16; ++j) {
                y[j+ 0] = dl * kvalues_iq4nl[qs[j] & 0xf];
                y[j+16] = dl * kvalues_iq4nl[qs[j] >>  4];
            }
            y  += 32;
            qs += 16;
        }
    }
}